

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::CheckCxxModuleStatus(cmGeneratorTarget *this,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  Cxx20SupportLevel CVar3;
  string *psVar4;
  cmAlphaNum local_1a8;
  cmAlphaNum local_178;
  string local_148;
  cmAlphaNum local_128;
  cmAlphaNum local_f8;
  string local_c8;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  string *local_18;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_18 = config;
  config_local = (string *)this;
  bVar2 = HaveCxx20ModuleSources(this);
  if (bVar2) {
    CVar3 = HaveCxxModuleSupport(this,local_18);
    switch(CVar3) {
    case MissingCxx:
      pcVar1 = this->Makefile;
      cmAlphaNum::cmAlphaNum(&local_68,"The \"");
      psVar4 = GetName_abi_cxx11_(this);
      cmAlphaNum::cmAlphaNum(&local_98,psVar4);
      cmStrCat<char[76]>(&local_38,&local_68,&local_98,
                         (char (*) [76])
                         "\" target has C++ module sources but the \"CXX\" language has not been enabled"
                        );
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      break;
    case MissingExperimentalFlag:
      pcVar1 = this->Makefile;
      cmAlphaNum::cmAlphaNum(&local_f8,"The \"");
      psVar4 = GetName_abi_cxx11_(this);
      cmAlphaNum::cmAlphaNum(&local_128,psVar4);
      cmStrCat<char[84]>(&local_c8,&local_f8,&local_128,
                         (char (*) [84])
                         "\" target has C++ module sources but its experimental support has not been requested"
                        );
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      break;
    case NoCxx20:
      pcVar1 = this->Makefile;
      cmAlphaNum::cmAlphaNum(&local_178,"The \"");
      psVar4 = GetName_abi_cxx11_(this);
      cmAlphaNum::cmAlphaNum(&local_1a8,psVar4);
      cmStrCat<char[71]>(&local_148,&local_178,&local_1a8,
                         (char (*) [71])
                         "\" target has C++ module sources but is not using at least \"cxx_std_20\""
                        );
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      break;
    case Supported:
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::CheckCxxModuleStatus(std::string const& config) const
{
  // Check for `CXX_MODULE*` file sets and a lack of support.
  if (this->HaveCxx20ModuleSources()) {
    switch (this->HaveCxxModuleSupport(config)) {
      case cmGeneratorTarget::Cxx20SupportLevel::MissingCxx:
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("The \"", this->GetName(),
                   "\" target has C++ module sources but the \"CXX\" language "
                   "has not been enabled"));
        break;
      case cmGeneratorTarget::Cxx20SupportLevel::MissingExperimentalFlag:
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("The \"", this->GetName(),
                   "\" target has C++ module sources but its experimental "
                   "support has not been requested"));
        break;
      case cmGeneratorTarget::Cxx20SupportLevel::NoCxx20:
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat(
            "The \"", this->GetName(),
            "\" target has C++ module sources but is not using at least "
            "\"cxx_std_20\""));
        break;
      case cmGeneratorTarget::Cxx20SupportLevel::Supported:
        // All is well.
        break;
    }
  }
}